

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O3

qsizetype QtPrivate::findByteArray(QByteArrayView haystack,qsizetype from,QByteArrayView needle)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  ulong __n;
  ulong uVar4;
  long haystackOffset;
  long lVar5;
  char *__s2;
  char *haystack_00;
  ulong haystackLen;
  long lVar6;
  char *needle_00;
  qsizetype qVar7;
  char *b;
  
  haystack_00 = haystack.m_data;
  haystackLen = haystack.m_size;
  needle_00 = needle.m_data;
  __n = needle.m_size;
  if (__n == 1) {
    lVar6 = 0;
    if (0 < (long)(from + haystackLen)) {
      lVar6 = from + haystackLen;
    }
    if (-1 < from) {
      lVar6 = from;
    }
    if ((haystackLen - lVar6 == 0 || (long)haystackLen < lVar6) ||
       (pvVar2 = memchr(haystack_00 + lVar6,(int)*needle_00,haystackLen - lVar6),
       pvVar2 == (void *)0x0)) {
      lVar6 = -1;
    }
    else {
      lVar6 = (long)pvVar2 - (long)haystack_00;
    }
  }
  else {
    haystackOffset = (from >> 0x3f & haystackLen) + from;
    qVar7 = -1;
    lVar6 = qVar7;
    if (((haystackOffset + __n <= haystackLen) && (lVar6 = haystackOffset, __n != 0)) &&
       (lVar6 = qVar7, haystackLen != 0)) {
      if (5 < (long)__n && 500 < (long)haystackLen) {
        qVar7 = qFindByteArrayBoyerMoore(haystack_00,haystackLen,haystackOffset,needle_00,__n);
        return qVar7;
      }
      __s2 = haystack_00 + haystackOffset;
      if ((long)__n < 1) {
        lVar5 = 0;
        lVar3 = 0;
      }
      else {
        uVar4 = 0;
        lVar3 = 0;
        lVar5 = 0;
        do {
          lVar5 = (long)needle_00[uVar4] + lVar5 * 2;
          lVar3 = (long)__s2[uVar4] + lVar3 * 2;
          uVar4 = uVar4 + 1;
        } while (__n != uVar4);
      }
      if (haystackOffset <= (long)(haystackLen - __n)) {
        lVar3 = lVar3 - __s2[__n - 1];
        do {
          lVar3 = __s2[__n - 1] + lVar3;
          if (((lVar3 == lVar5) && (*needle_00 == *__s2)) &&
             (iVar1 = bcmp(needle_00,__s2,__n), iVar1 == 0)) {
            return (long)__s2 - (long)haystack_00;
          }
          if (__n < 0x41) {
            lVar3 = lVar3 - ((long)*__s2 << ((byte)(__n - 1) & 0x3f));
          }
          lVar3 = lVar3 * 2;
          __s2 = __s2 + 1;
        } while (__s2 <= haystack_00 + (haystackLen - __n));
      }
    }
  }
  return lVar6;
}

Assistant:

qsizetype QtPrivate::findByteArray(QByteArrayView haystack, qsizetype from, QByteArrayView needle) noexcept
{
    const auto haystack0 = haystack.data();
    const auto l = haystack.size();
    const auto sl = needle.size();
#if !QT_CONFIG(memmem)
    if (sl == 1)
        return findByteArray(haystack, from, needle.front());
#endif

    if (from < 0)
        from += l;
    if (std::size_t(sl + from) > std::size_t(l))
        return -1;
    if (!sl)
        return from;
    if (!l)
        return -1;

#if QT_CONFIG(memmem)
    auto where = memmem(haystack0 + from, l - from, needle.data(), sl);
    return where ? static_cast<const char *>(where) - haystack0 : -1;
#endif

    /*
      We use the Boyer-Moore algorithm in cases where the overhead
      for the skip table should pay off, otherwise we use a simple
      hash function.
    */
    if (l > 500 && sl > 5)
        return qFindByteArrayBoyerMoore(haystack0, l, from, needle.data(), sl);
    return qFindByteArray(haystack0, l, from, needle.data(), sl);
}